

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,FunctionCallNode *node)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  PrintVisitor *pPVar4;
  string *psVar5;
  undefined4 extraout_var;
  element_type *peVar6;
  FunctionCallNode *in_RSI;
  long in_RDI;
  shared_ptr<ExpressionNode> *arg;
  const_iterator __end1;
  const_iterator __begin1;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *__range1
  ;
  PrintVisitor visitor;
  string *stream;
  PrintVisitor *in_stack_ffffffffffffff08;
  _Self local_b0;
  _Self local_a8;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *local_a0
  ;
  undefined1 local_98 [24];
  string local_80 [32];
  string local_60 [48];
  string local_30 [32];
  FunctionCallNode *local_10;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> *this_00;
  
  poVar3 = *(ostream **)(in_RDI + 8);
  local_10 = in_RSI;
  indent_abi_cxx11_(in_stack_ffffffffffffff08);
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,"FunctionCallNode:\n");
  std::__cxx11::string::~string(local_30);
  poVar3 = *(ostream **)(in_RDI + 8);
  indent_abi_cxx11_(in_stack_ffffffffffffff08);
  poVar3 = std::operator<<(poVar3,local_60);
  pPVar4 = (PrintVisitor *)std::operator<<(poVar3,"Name: ");
  psVar5 = FunctionCallNode::getName_abi_cxx11_(local_10);
  poVar3 = std::operator<<((ostream *)pPVar4,(string *)psVar5);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string(local_60);
  poVar3 = *(ostream **)(in_RDI + 8);
  stream = local_80;
  indent_abi_cxx11_(pPVar4);
  pPVar4 = (PrintVisitor *)std::operator<<(poVar3,stream);
  std::operator<<((ostream *)pPVar4,"Arguments:\n");
  std::__cxx11::string::~string(local_80);
  PrintVisitor(pPVar4,(ostream *)stream,(uint)((ulong)poVar3 >> 0x20));
  iVar2 = (*(local_10->super_CallNode).super_ExpressionNode.super_Node._vptr_Node[3])();
  this_00 = (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
             *)CONCAT44(extraout_var,iVar2);
  local_a0 = this_00;
  local_a8._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
       begin(this_00);
  local_b0._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::end
                 (this_00);
  while( true ) {
    bVar1 = std::operator!=(&local_a8,&local_b0);
    if (!bVar1) break;
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator*
              ((_List_const_iterator<std::shared_ptr<ExpressionNode>_> *)poVar3);
    peVar6 = std::__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<ExpressionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x138a4f);
    (*(peVar6->super_Node)._vptr_Node[2])(peVar6,local_98);
    std::_List_const_iterator<std::shared_ptr<ExpressionNode>_>::operator++(&local_a8);
  }
  ~PrintVisitor((PrintVisitor *)0x138b0f);
  return;
}

Assistant:

void PrintVisitor::visit(const FunctionCallNode& node)
{
  stream_ << indent() << "FunctionCallNode:\n";
  stream_ << indent() << "Name: " << node.getName() << "\n";
  stream_ << indent() << "Arguments:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  for(const auto& arg : node.getArguments())
  {
    arg->accept(visitor);
  }
}